

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O0

size_t __thiscall axl::err::Error::createStringError(Error *this,StringRef *string)

{
  size_t sVar1;
  ErrorHdr *dst_00;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  size_t in_RDI;
  char *dst;
  ErrorHdr *error;
  size_t size;
  size_t length;
  ErrorHdr *src;
  size_t local_8;
  
  sVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLength(in_RSI);
  local_8 = sVar1 + 0x19;
  dst_00 = rc::Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>::createBuffer
                     (&this->
                       super_Buf<axl::err::ErrorHdr,_axl::err::SizeOfError,_axl::err::ErrorRef>,
                      (size_t)string,length._7_1_);
  if (dst_00 == (ErrorHdr *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    dst_00->m_size = (uint32_t)local_8;
    *(undefined8 *)&(dst_00->m_guid).field_0 = g_stdErrorGuid;
    *(undefined8 *)((long)&(dst_00->m_guid).field_0 + 8) = DAT_0020e16c;
    dst_00->m_code = 1;
    src = dst_00 + 1;
    sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cp(in_RSI);
    __wrap_memcpy(dst_00,src,in_RDI);
    *(undefined1 *)((long)&src->m_size + sVar1) = 0;
  }
  return local_8;
}

Assistant:

size_t
Error::createStringError(const sl::StringRef& string) {
	size_t length = string.getLength();
	size_t size = sizeof(ErrorHdr) + length + 1;

	ErrorHdr* error = createBuffer(size);
	if (!error)
		return -1;

	error->m_size = (uint32_t)size;
	error->m_guid = g_stdErrorGuid;
	error->m_code = StdErrorCode_String;

	char* dst = (char*)(error + 1);

	memcpy(dst, string.cp(), length);
	dst[length] = 0;

	return size;
}